

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

void __thiscall
cmCTestCoverageHandler::EndCoverageLogFile
          (cmCTestCoverageHandler *this,cmGeneratedFileStream *ostr,int logFileCount)

{
  cmCTest *this_00;
  ostream *poVar1;
  char *msg;
  string local_5d0 [48];
  ostringstream local_5a0 [8];
  ostringstream cmCTestLog_msg;
  char local_428 [8];
  char covLogFilename [1024];
  int logFileCount_local;
  cmGeneratedFileStream *ostr_local;
  cmCTestCoverageHandler *this_local;
  
  snprintf(local_428,0x400,"CoverageLog-%d.xml",(ulong)(uint)logFileCount);
  std::__cxx11::ostringstream::ostringstream(local_5a0);
  poVar1 = std::operator<<((ostream *)local_5a0,"Close file: ");
  poVar1 = std::operator<<(poVar1,local_428);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  this_00 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  msg = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(this_00,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
               ,0x61,msg,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
  std::__cxx11::string::~string(local_5d0);
  std::__cxx11::ostringstream::~ostringstream(local_5a0);
  cmGeneratedFileStream::Close(ostr);
  return;
}

Assistant:

void cmCTestCoverageHandler::EndCoverageLogFile(cmGeneratedFileStream& ostr,
                                                int logFileCount)
{
  char covLogFilename[1024];
  snprintf(covLogFilename, sizeof(covLogFilename), "CoverageLog-%d.xml",
           logFileCount);
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Close file: " << covLogFilename << std::endl,
                     this->Quiet);
  ostr.Close();
}